

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

UObject * __thiscall
icu_63::CalendarService::handleDefault
          (CalendarService *this,ICUServiceKey *key,UnicodeString *param_2,UErrorCode *status)

{
  GregorianCalendar *this_00;
  Locale *this_01;
  GregorianCalendar *local_148;
  Calendar *nc;
  undefined1 local_110 [8];
  Locale loc;
  LocaleKey *lkey;
  UErrorCode *status_local;
  UnicodeString *param_2_local;
  ICUServiceKey *key_local;
  CalendarService *this_local;
  
  this_01 = (Locale *)local_110;
  loc._216_8_ = key;
  Locale::Locale(this_01);
  (**(code **)(*(long *)loc._216_8_ + 0x58))();
  this_00 = (GregorianCalendar *)UMemory::operator_new((UMemory *)0x290,(size_t)this_01);
  local_148 = (GregorianCalendar *)0x0;
  if (this_00 != (GregorianCalendar *)0x0) {
    GregorianCalendar::GregorianCalendar(this_00,(Locale *)local_110,status);
    local_148 = this_00;
  }
  Locale::~Locale((Locale *)local_110);
  return (UObject *)local_148;
}

Assistant:

virtual UObject* handleDefault(const ICUServiceKey& key, UnicodeString* /*actualID*/, UErrorCode& status) const {
        LocaleKey& lkey = (LocaleKey&)key;
        //int32_t kind = lkey.kind();

        Locale loc;
        lkey.canonicalLocale(loc);

#ifdef U_DEBUG_CALSVC
        Locale loc2;
        lkey.currentLocale(loc2);
        fprintf(stderr, "CalSvc:handleDefault for currentLoc %s, canloc %s\n", (const char*)loc.getName(),  (const char*)loc2.getName());
#endif
        Calendar *nc =  new GregorianCalendar(loc, status);

#ifdef U_DEBUG_CALSVC
        UErrorCode status2 = U_ZERO_ERROR;
        fprintf(stderr, "New default calendar has tz=%d\n", ((Calendar*)nc)->get(UCAL_ZONE_OFFSET, status2));
#endif
        return nc;
    }